

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::
         write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  appender aVar1;
  basic_format_specs<char> *in_stack_000001e8;
  decimal_fp<float> *in_stack_000001f0;
  locale_ref in_stack_000001f8;
  float_specs in_stack_00000200;
  appender in_stack_00000208;
  
  aVar1 = do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>
                    (in_stack_00000208,in_stack_000001f0,in_stack_000001e8,in_stack_00000200,
                     in_stack_000001f8);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, const DecimalFP& f,
                                 const basic_format_specs<Char>& specs,
                                 float_specs fspecs, locale_ref loc)
    -> OutputIt {
  if (is_constant_evaluated()) {
    return do_write_float<OutputIt, DecimalFP, Char,
                          fallback_digit_grouping<Char>>(out, f, specs, fspecs,
                                                         loc);
  } else {
    return do_write_float(out, f, specs, fspecs, loc);
  }
}